

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void * __thiscall
google::protobuf::internal::SerialArena::AllocateAlignedWithCleanupFallback
          (SerialArena *this,size_t n,size_t align,_func_void_void_ptr *destructor)

{
  __pointer_type pAVar1;
  ArenaBlock *this_00;
  __pointer_type pcVar2;
  CleanupNode *pCVar3;
  char *pcVar4;
  ArenaBlock *this_01;
  char *pcVar5;
  ArenaAlign AVar6;
  CleanupNode *pCVar7;
  string *psVar8;
  CleanupNode *pCVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  __pointer_type pAVar12;
  size_t last_size;
  __pointer_type pAVar13;
  size_t min_bytes;
  void *elem;
  SizedPtr SVar14;
  LogMessageFatal aLStack_48 [16];
  ulong local_38;
  
  do {
    if (align < 9) {
      min_bytes = n + 7 & 0xfffffffffffffff8;
    }
    else {
      AVar6 = ArenaAlignAs(align);
      if ((AVar6.align & 7) != 0) {
        __assert_fail("false && \"ArenaAlignDefault::IsAligned(align)\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/arena_align.h"
                      ,0x84,
                      "auto google::protobuf::internal::ArenaAlign::Padded(size_t)::(anonymous class)::operator()() const"
                     );
      }
      min_bytes = (AVar6.align + n) - 8;
    }
    this_00 = (this->head_)._M_b._M_p;
    if (this_00->size == 0) {
      last_size = 0;
    }
    else {
      pcVar2 = (this->ptr_)._M_b._M_p;
      local_38 = align;
      pcVar4 = ArenaBlock::Pointer(this_00,0x10);
      (this->space_used_).super___atomic_base<unsigned_long>._M_i =
           (__int_type_conflict3)
           (pcVar2 + ((this->space_used_).super___atomic_base<unsigned_long>._M_i - (long)pcVar4));
      last_size = this_00->size;
      align = local_38;
    }
    SVar14 = anon_unknown_12::AllocateBlock
                       ((AllocationPolicy *)
                        ((this->parent_->alloc_policy_).policy_ & 0xfffffffffffffff8),last_size,
                        min_bytes);
    this_01 = (ArenaBlock *)SVar14.p;
    (this->space_allocated_).super___atomic_base<unsigned_long>._M_i =
         (this->space_allocated_).super___atomic_base<unsigned_long>._M_i + SVar14.n;
    ArenaBlock::ArenaBlock(this_01,this_00,SVar14.n);
    pcVar4 = ArenaBlock::Pointer(this_01,0x10);
    pcVar5 = ArenaBlock::Pointer(this_01,this_01->size & 0xfffffffffffffff8);
    (this->ptr_)._M_b._M_p = pcVar4;
    this->prefetch_ptr_ = pcVar4;
    this->limit_ = pcVar5;
    (this->head_)._M_b._M_p = this_01;
    AVar6 = ArenaAlignAs(align);
    pcVar2 = (this->ptr_)._M_b._M_p;
    if (((ulong)pcVar2 & 7) != 0) {
      __assert_fail("false && \"ArenaAlignDefault::IsAligned(ptr)\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/arena_align.h"
                    ,0x90,
                    "auto google::protobuf::internal::ArenaAlign::CeilDefaultAligned(char *)::(anonymous class)::operator()() const"
                   );
    }
    n = n + 7 & 0xfffffffffffffff8;
    elem = (void *)(-AVar6.align & (ulong)(pcVar2 + (AVar6.align - 1)));
    pAVar1 = (__pointer_type)((long)elem + n);
  } while ((__pointer_type)this->limit_ < pAVar1);
  (this->ptr_)._M_b._M_p = (__pointer_type)pAVar1;
  pCVar7 = (this->cleanup_list_).next_;
  if (pCVar7 < (this->cleanup_list_).limit_) {
    (this->cleanup_list_).next_ = pCVar7 + 1;
    pCVar7->elem = elem;
    pCVar7->destructor = destructor;
  }
  else {
    cleanup::ChunkList::AddFallback(&this->cleanup_list_,elem,destructor,this);
  }
  pCVar7 = (CleanupNode *)(this->cleanup_list_).prefetch_ptr_;
  if ((pCVar7 != (CleanupNode *)0x0) && (pCVar7 < (CleanupNode *)(this->cleanup_list_).head_)) {
    pcVar4 = 
    "static_cast<const void*>(cleanup_list_.prefetch_ptr_) == nullptr || static_cast<const void*>(cleanup_list_.prefetch_ptr_) >= cleanup_list_.head_"
    ;
    uVar10 = 0x90;
    uVar11 = 0x137;
    goto LAB_001c98c3;
  }
  pCVar3 = (this->cleanup_list_).next_;
  if (((long)pCVar7 - (long)pCVar3 < 0x181) &&
     (pCVar9 = (this->cleanup_list_).limit_, pCVar7 < pCVar9)) {
    if (pCVar3 < pCVar7) {
      pCVar3 = pCVar7;
    }
    pCVar7 = pCVar3;
    if (pCVar7 != (CleanupNode *)0x0) {
      if (pCVar7 + 0x18 < pCVar9) {
        pCVar9 = pCVar7 + 0x18;
      }
      for (; pCVar7 < pCVar9; pCVar7 = pCVar7 + 4) {
      }
      goto LAB_001c975c;
    }
  }
  else {
LAB_001c975c:
    (this->cleanup_list_).prefetch_ptr_ = (char *)pCVar7;
    pAVar12 = (__pointer_type)(this->ptr_)._M_b._M_p;
    pAVar13 = (__pointer_type)this->limit_;
    if (pAVar13 < pAVar12) {
      psVar8 = absl::lts_20240722::log_internal::MakeCheckOpString<char_const*,char_const*>
                         ((char *)pAVar13,(char *)pAVar12,"limit_ >= ptr()");
      pcVar4 = *(char **)psVar8;
      uVar10 = *(undefined8 *)(psVar8 + 8);
      uVar11 = 0xf3;
      goto LAB_001c98c3;
    }
    pAVar12 = (__pointer_type)this->prefetch_ptr_;
    if ((pAVar12 != (__pointer_type)0x0) && (pAVar12 < (this->head_)._M_b._M_p)) {
      pcVar4 = 
      "static_cast<const void*>(prefetch_ptr_) == nullptr || static_cast<const void*>(prefetch_ptr_) >= head()"
      ;
      uVar10 = 0x67;
      uVar11 = 0x12e;
      goto LAB_001c98c3;
    }
    if ((0x400 < (long)pAVar12 - (long)pAVar1) || (pAVar13 <= pAVar12)) {
LAB_001c979c:
      this->prefetch_ptr_ = (char *)pAVar12;
      return elem;
    }
    if (pAVar1 < pAVar12) {
      pAVar1 = pAVar12;
    }
    pAVar12 = pAVar1;
    if (pAVar12 != (__pointer_type)0x0) {
      if (pAVar12 + 0x40 < pAVar13) {
        pAVar13 = pAVar12 + 0x40;
      }
      for (; pAVar12 < pAVar13; pAVar12 = pAVar12 + 4) {
      }
      goto LAB_001c979c;
    }
  }
  pcVar4 = "prefetch_ptr != nullptr";
  uVar10 = 0x17;
  uVar11 = 0x123;
LAB_001c98c3:
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (aLStack_48,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/serial_arena.h"
             ,uVar11,uVar10,pcVar4);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_48);
}

Assistant:

PROTOBUF_NOINLINE
void* SerialArena::AllocateAlignedWithCleanupFallback(
    size_t n, size_t align, void (*destructor)(void*)) {
  size_t required = AlignUpTo(n, align);
  AllocateNewBlock(required);
  return AllocateAlignedWithCleanup(n, align, destructor);
}